

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

void Saig_StrSimSetFinalMatching(Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Aig_Man_t *pAVar10;
  long lVar11;
  uint uVar12;
  
  pAVar10 = p0;
  Aig_ManIncrementTravId(p0);
  pVVar6 = p0->vObjs;
  iVar1 = pVVar6->nSize;
  if ((long)iVar1 < 1) {
    iVar7 = 0;
    iVar8 = 0;
  }
  else {
    pAVar10 = (Aig_Man_t *)pVVar6->pArray;
    lVar11 = 0;
    iVar7 = 0;
    iVar8 = 0;
    do {
      pAVar2 = *(Aig_Obj_t **)(pAVar10->nObjs + lVar11 * 2 + -0x20);
      if (((pAVar2 != (Aig_Obj_t *)0x0) && (ppAVar3 = p0->pReprs, ppAVar3 != (Aig_Obj_t **)0x0)) &&
         (pAVar4 = ppAVar3[pAVar2->Id], pAVar4 != (Aig_Obj_t *)0x0)) {
        if ((p1->pReprs == (Aig_Obj_t **)0x0) || (pAVar2 != p1->pReprs[pAVar4->Id])) {
          __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigStrSim.c"
                        ,0x248,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
        }
        iVar8 = iVar8 + 1;
        uVar9 = (uint)*(undefined8 *)&pAVar2->field_0x18;
        if ((uVar9 & 7) - 7 < 0xfffffffe) {
          if (((uVar9 & 7) == 2) && (p0->nTruePis <= (pAVar2->field_0).CioId)) {
            if (((*(uint *)&pAVar4->field_0x18 & 7) != 2) ||
               ((pAVar4->field_0).CioId < p1->nTruePis)) {
              __assert_fail("Saig_ObjIsLo(p1, pObj1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigStrSim.c"
                            ,0x259,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
            }
            uVar9 = ((pAVar2->field_0).CioId - p0->nTruePis) + p0->nTruePos;
            if (((((int)uVar9 < 0) || (p0->vCos->nSize <= (int)uVar9)) ||
                (uVar12 = ((pAVar4->field_0).CioId - p1->nTruePis) + p1->nTruePos, (int)uVar12 < 0))
               || (p1->vCos->nSize <= (int)uVar12)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pAVar4 = *(Aig_Obj_t **)((long)p0->vCos->pArray[uVar9] + 8);
            pAVar5 = *(Aig_Obj_t **)((long)p1->vCos->pArray[uVar12] + 8);
LAB_0063fa16:
            if (ppAVar3[*(int *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x24)] !=
                (Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe)) goto LAB_0063fa20;
          }
        }
        else {
          if ((*(uint *)&pAVar4->field_0x18 & 7) - 7 < 0xfffffffe) {
            __assert_fail("Aig_ObjIsNode(pObj1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigStrSim.c"
                          ,0x24b,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
          }
          if (ppAVar3[*(int *)(((ulong)pAVar2->pFanin0 & 0xfffffffffffffffe) + 0x24)] ==
              (Aig_Obj_t *)((ulong)pAVar4->pFanin0 & 0xfffffffffffffffe)) {
            pAVar5 = pAVar4->pFanin1;
            pAVar4 = pAVar2->pFanin1;
            goto LAB_0063fa16;
          }
LAB_0063fa20:
          pAVar2->TravId = p0->nTravIds;
          iVar7 = iVar7 + 1;
        }
      }
      lVar11 = lVar11 + 1;
    } while (iVar1 != lVar11);
    if (0 < iVar1) {
      lVar11 = 0;
      do {
        pAVar2 = (Aig_Obj_t *)pVVar6->pArray[lVar11];
        if ((pAVar2 != (Aig_Obj_t *)0x0) && (ppAVar3 = p0->pReprs, ppAVar3 != (Aig_Obj_t **)0x0)) {
          if (ppAVar3[pAVar2->Id] != (Aig_Obj_t *)0x0) {
            if ((p1->pReprs == (Aig_Obj_t **)0x0) ||
               (iVar1 = ppAVar3[pAVar2->Id]->Id, pAVar2 != p1->pReprs[iVar1])) {
              __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigStrSim.c"
                            ,0x269,"void Saig_StrSimSetFinalMatching(Aig_Man_t *, Aig_Man_t *)");
            }
            if (pAVar2->TravId == p0->nTravIds) {
              ppAVar3[pAVar2->Id] = (Aig_Obj_t *)0x0;
              if (p1->pReprs == (Aig_Obj_t **)0x0) {
                __assert_fail("p->pReprs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                              ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
              }
              p1->pReprs[iVar1] = (Aig_Obj_t *)0x0;
              pVVar6 = p0->vObjs;
            }
          }
        }
        lVar11 = lVar11 + 1;
        pAVar10 = (Aig_Man_t *)(long)pVVar6->nSize;
      } while (lVar11 < (long)pAVar10);
    }
  }
  Abc_Print((int)pAVar10,"Total matches = %6d.  Wrong matches = %6d.  Ratio = %5.2f %%\n",
            ((double)iVar7 * 100.0) / (double)iVar8);
  return;
}

Assistant:

void Saig_StrSimSetFinalMatching( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t * pObj0, * pObj1;
    Aig_Obj_t * pFanin00, * pFanin01;
    Aig_Obj_t * pFanin10, * pFanin11;
    int i, CountAll = 0, CountNot = 0;
    Aig_ManIncrementTravId( p0 );
    Aig_ManForEachObj( p0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        if ( pObj1 == NULL )
            continue;
        CountAll++;
        assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );
        if ( Aig_ObjIsNode(pObj0) )
        {
            assert( Aig_ObjIsNode(pObj1) );
            pFanin00 = Aig_ObjFanin0(pObj0);
            pFanin01 = Aig_ObjFanin1(pObj0);
            pFanin10 = Aig_ObjFanin0(pObj1);
            pFanin11 = Aig_ObjFanin1(pObj1);
            if ( Aig_ObjRepr(p0, pFanin00) != pFanin10 ||
                 Aig_ObjRepr(p0, pFanin01) != pFanin11 )
            {
                Aig_ObjSetTravIdCurrent(p0, pObj0);
                CountNot++;
            }
        }
        else if ( Saig_ObjIsLo(p0, pObj0) )
        {
            assert( Saig_ObjIsLo(p1, pObj1) );
            pFanin00 = Aig_ObjFanin0( Saig_ObjLoToLi(p0, pObj0) );
            pFanin10 = Aig_ObjFanin0( Saig_ObjLoToLi(p1, pObj1) );
            if ( Aig_ObjRepr(p0, pFanin00) != pFanin10 )
            {
                Aig_ObjSetTravIdCurrent(p0, pObj0);
                CountNot++;
            }
        }
    }
    // remove irrelevant matches
    Aig_ManForEachObj( p0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        if ( pObj1 == NULL )
            continue;
        assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );
        if ( Aig_ObjIsTravIdCurrent( p0, pObj0 ) )
        {
            Aig_ObjSetRepr( p0, pObj0, NULL );
            Aig_ObjSetRepr( p1, pObj1, NULL );
        }
    }
    Abc_Print( 1, "Total matches = %6d.  Wrong matches = %6d.  Ratio = %5.2f %%\n",
        CountAll, CountNot, 100.0*CountNot/CountAll );
}